

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cat.cpp
# Opt level: O0

bool __thiscall CmdCat::Execute(CmdCat *this)

{
  bool bVar1;
  byte bVar2;
  FileType FVar3;
  size_type sVar4;
  ostream *poVar5;
  reference pvVar6;
  reference pbVar7;
  char *pcVar8;
  long *plVar9;
  char local_241 [8];
  char t;
  char local_230 [8];
  ifstream fin;
  _Self local_28;
  _Self local_20;
  iterator i;
  CmdCat *this_local;
  
  i._M_node = (_List_node_base *)this;
  sVar4 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_Command).option);
  if (sVar4 == 0) {
    sVar4 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_Command).parameter);
    if (sVar4 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"cat: too few arguments given");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      local_20._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&(this->super_Command).parameter);
      while( true ) {
        local_28._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&(this->super_Command).parameter);
        bVar1 = std::operator!=(&local_20,&local_28);
        if (!bVar1) break;
        pbVar7 = std::
                 _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        FVar3 = DirUtils::GetFileType(pbVar7);
        if (FVar3 == DU_DIRECTORY) {
          poVar5 = std::operator<<((ostream *)&std::cout,"cat: ");
          pbVar7 = std::
                   _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_20);
          poVar5 = std::operator<<(poVar5,(string *)pbVar7);
          poVar5 = std::operator<<(poVar5,": Is a directory");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          std::
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_20);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream(local_230,pcVar8,_S_bin);
          bVar2 = std::ifstream::is_open();
          if ((bVar2 & 1) == 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"cat: ");
            pbVar7 = std::
                     _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_20);
            poVar5 = std::operator<<(poVar5,(string *)pbVar7);
            poVar5 = std::operator<<(poVar5,": No such file or directory");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            local_241[1] = '\x04';
            local_241[2] = '\0';
            local_241[3] = '\0';
            local_241[4] = '\0';
          }
          else {
            while( true ) {
              plVar9 = (long *)std::istream::read(local_230,(long)local_241);
              bVar1 = std::ios::operator_cast_to_bool
                                ((ios *)((long)plVar9 + *(long *)(*plVar9 + -0x18)));
              if (!bVar1) break;
              std::operator<<((ostream *)&std::cout,local_241[0]);
            }
            std::ifstream::close();
            local_241[1] = '\0';
            local_241[2] = '\0';
            local_241[3] = '\0';
            local_241[4] = '\0';
          }
          std::ifstream::~ifstream(local_230);
        }
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_20,0);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"cat: invalid option -- \'");
    pvVar6 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(&(this->super_Command).option);
    poVar5 = std::operator<<(poVar5,(string *)pvVar6);
    poVar5 = std::operator<<(poVar5,"\'");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Try \'cat -- help\' for more information.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CmdCat::Execute(){
	if(option.size() != 0){	
		cout << "cat: invalid option -- '" << option.front() << "'" << endl;
		cout << "Try 'cat -- help' for more information." << endl;
		return false;
	}
	
	if(parameter.size() == 0){	
		cout << "cat: too few arguments given" << endl;
		return false;
	}

	for(auto i = parameter.begin(); i != parameter.end(); i++){
		if(GetFileType(*i) == DU_DIRECTORY){
			cout << "cat: " << (*i) << ": Is a directory" << endl;
			continue;
		}
		ifstream fin((*i).c_str(), ios::binary);
		if(!fin.is_open()){
			cout << "cat: " << (*i) << ": No such file or directory" << endl;
			continue;
		}
		char t;
		while(fin.read(&t, sizeof(t))){
			cout << t;
		}
		fin.close();
	}

	return true;
}